

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddMisc.c
# Opt level: O1

void Cudd_zddPrintSubtable(DdManager *table)

{
  long lVar1;
  DdNode *pDVar2;
  DdSubtable *pDVar3;
  DdNode *pDVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  DdNode *pDVar8;
  ulong uVar9;
  
  if (0 < (long)table->sizeZ) {
    pDVar2 = table->one;
    lVar7 = (long)table->sizeZ;
    do {
      lVar1 = lVar7 + -1;
      pDVar3 = table->subtableZ;
      printf("subtable[%d]:\n");
      uVar6 = pDVar3[lVar1].slots - 1;
      if (-1 < (int)uVar6) {
        uVar9 = (ulong)uVar6;
        do {
          for (pDVar8 = pDVar3[lVar1].nodelist[uVar9]; pDVar8 != (DdNode *)0x0;
              pDVar8 = pDVar8->next) {
            fprintf((FILE *)table->out,"ID = 0x%lx\tindex = %u\tr = %u\t",(ulong)pDVar8 / 0x28,
                    (ulong)pDVar8->index,(ulong)pDVar8->ref);
            pDVar4 = (pDVar8->type).kids.T;
            if (*(int *)((ulong)pDVar4 & 0xfffffffffffffffe) == 0x7fffffff) {
              fprintf((FILE *)table->out,"T = %d\t\t",(ulong)(pDVar4 == pDVar2));
            }
            else {
              fprintf((FILE *)table->out,"T = 0x%lx\t",(ulong)pDVar4 / 0x28);
            }
            pDVar4 = (pDVar8->type).kids.E;
            if (*(int *)((ulong)pDVar4 & 0xfffffffffffffffe) == 0x7fffffff) {
              fprintf((FILE *)table->out,"E = %d\n",(ulong)(pDVar4 == pDVar2));
            }
            else {
              fprintf((FILE *)table->out,"E = 0x%lx\n",(ulong)pDVar4 / 0x28);
            }
          }
          bVar5 = 0 < (long)uVar9;
          uVar9 = uVar9 - 1;
        } while (bVar5);
      }
      bVar5 = 1 < lVar7;
      lVar7 = lVar1;
    } while (bVar5);
  }
  putchar(10);
  return;
}

Assistant:

void
Cudd_zddPrintSubtable(
  DdManager * table)
{
    int         i, j;
    DdNode      *z1, *z1_next, *base;
    DdSubtable  *ZSubTable;

    base = table->one;
    for (i = table->sizeZ - 1; i >= 0; i--) {
        ZSubTable = &(table->subtableZ[i]);
        printf("subtable[%d]:\n", i);
        for (j = ZSubTable->slots - 1; j >= 0; j--) {
            z1 = ZSubTable->nodelist[j];
            while (z1 != NIL(DdNode)) {
                (void) fprintf(table->out,
#if SIZEOF_VOID_P == 8
                    "ID = 0x%lx\tindex = %u\tr = %u\t",
                    (ptruint) z1 / (ptruint) sizeof(DdNode),
                    z1->index, z1->ref);
#else
                    "ID = 0x%x\tindex = %hu\tr = %hu\t",
                    (ptruint) z1 / (ptruint) sizeof(DdNode),
                    z1->index, z1->ref);
#endif
                z1_next = cuddT(z1);
                if (Cudd_IsConstant(z1_next)) {
                    (void) fprintf(table->out, "T = %d\t\t",
                        (z1_next == base));
                }
                else {
#if SIZEOF_VOID_P == 8
                    (void) fprintf(table->out, "T = 0x%lx\t",
                        (ptruint) z1_next / (ptruint) sizeof(DdNode));
#else
                    (void) fprintf(table->out, "T = 0x%x\t",
                        (ptruint) z1_next / (ptruint) sizeof(DdNode));
#endif
                }
                z1_next = cuddE(z1);
                if (Cudd_IsConstant(z1_next)) {
                    (void) fprintf(table->out, "E = %d\n",
                        (z1_next == base));
                }
                else {
#if SIZEOF_VOID_P == 8
                    (void) fprintf(table->out, "E = 0x%lx\n",
                        (ptruint) z1_next / (ptruint) sizeof(DdNode));
#else
                    (void) fprintf(table->out, "E = 0x%x\n",
                        (ptruint) z1_next / (ptruint) sizeof(DdNode));
#endif
                }

                z1_next = z1->next;
                z1 = z1_next;
            }
        }
    }
    putchar('\n');

}